

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int setup_initial_key(st_quicly_cipher_context_t *ctx,ptls_cipher_suite_t *cs,void *master_secret,
                     char *label,int is_enc,quicly_conn_t *conn)

{
  size_t outlen;
  int iVar1;
  quicly_crypto_engine_t *pqVar2;
  ptls_iovec_t secret;
  uint8_t aead_secret [64];
  undefined1 local_78 [72];
  
  outlen = cs->hash->digest_size;
  secret.len = outlen;
  secret.base = (uint8_t *)master_secret;
  iVar1 = ptls_hkdf_expand_label
                    (cs->hash,local_78,outlen,secret,label,(ptls_iovec_t)ZEXT816(0),(char *)0x0);
  if (iVar1 == 0) {
    if (conn == (quicly_conn_t *)0x0) {
      pqVar2 = &quicly_default_crypto_engine;
    }
    else {
      pqVar2 = ((conn->super).ctx)->crypto_engine;
    }
    iVar1 = (*pqVar2->setup_cipher)
                      (pqVar2,conn,0,is_enc,&ctx->header_protection,&ctx->aead,cs->aead,cs->hash,
                       local_78);
  }
  (*ptls_clear_memory)(local_78,0x40);
  return iVar1;
}

Assistant:

static int setup_initial_key(struct st_quicly_cipher_context_t *ctx, ptls_cipher_suite_t *cs, const void *master_secret,
                             const char *label, int is_enc, quicly_conn_t *conn)
{
    uint8_t aead_secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if ((ret = ptls_hkdf_expand_label(cs->hash, aead_secret, cs->hash->digest_size,
                                      ptls_iovec_init(master_secret, cs->hash->digest_size), label, ptls_iovec_init(NULL, 0),
                                      NULL)) != 0)
        goto Exit;
    if ((ret = setup_cipher(conn, QUICLY_EPOCH_INITIAL, is_enc, &ctx->header_protection, &ctx->aead, cs->aead, cs->hash,
                            aead_secret)) != 0)
        goto Exit;

Exit:
    ptls_clear_memory(aead_secret, sizeof(aead_secret));
    return ret;
}